

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O3

void __thiscall
QtMWidgets::NavigationButton::paintEvent(NavigationButton *this,QPaintEvent *param_1)

{
  Direction DVar1;
  int iVar2;
  int iVar3;
  NavigationButtonPrivate *pNVar4;
  uint flags;
  int iVar5;
  int iVar6;
  QPainter p;
  QString t;
  QStyleOption opt;
  undefined1 local_d0 [8];
  QRect local_c8;
  QRect local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  QString local_98;
  QString local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  QStyleOption local_58 [64];
  
  QPainter::QPainter((QPainter *)local_d0,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)(QPainter *)local_d0,true);
  local_a8 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x1c);
  uStack_a0 = 0;
  local_68 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x14);
  uStack_60 = 0;
  local_c8._0_8_ = 0.0;
  local_c8.x2 = -1;
  local_c8.y2 = -1;
  local_b8.x1 = 0;
  local_b8.y1 = 0;
  local_b8.x2 = -1;
  local_b8.y2 = -1;
  iVar2 = FingerGeometry::width();
  iVar3 = FingerGeometry::height();
  iVar2 = (int)((double)((ulong)((double)iVar2 / 5.0) & 0x8000000000000000 | (ulong)DAT_0017b3a0) +
               (double)iVar2 / 5.0);
  local_a8._0_4_ = (int)local_a8 - (int)local_68;
  local_a8._4_4_ = local_a8._4_4_ - local_68._4_4_;
  iVar3 = (int)((double)((ulong)((double)iVar3 / 3.0) & 0x8000000000000000 | (ulong)DAT_0017b3a0) +
               (double)iVar3 / 3.0);
  uStack_a0 = CONCAT44(uStack_a0._4_4_ - uStack_60._4_4_,(int)uStack_a0 - (int)uStack_60);
  iVar5 = local_a8._4_4_ - iVar3;
  iVar5 = (iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1;
  DVar1 = ((this->d).d)->direction;
  if (DVar1 == Left) {
    iVar6 = (int)local_a8 - iVar2;
    local_b8.y1 = 0;
    local_b8.x1 = iVar2 + 10;
    flags = 0x981;
    local_b8.x2 = (int)local_a8;
  }
  else {
    flags = 0x980;
    if (DVar1 != Right) goto LAB_001571f2;
    iVar6 = (int)local_a8 - iVar2;
    local_b8.x1 = 0;
    local_b8.y1 = 0;
    flags = 0x982;
    local_b8.x2 = iVar6 + -10;
  }
  local_c8.y2 = iVar3 + iVar5 + -1;
  local_c8.x2 = (int)local_a8;
  local_c8.y1 = iVar5;
  local_c8.x1 = iVar6 + 1;
  local_b8.y2 = local_a8._4_4_;
LAB_001571f2:
  QStyleOption::QStyleOption(local_58,1,0);
  QStyleOption::initFrom((QWidget *)local_58);
  pNVar4 = (NavigationButtonPrivate *)this;
  QAbstractButton::text();
  NavigationButtonPrivate::makeString(&local_80,pNVar4,&local_98,&local_b8,flags,local_58);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
    }
  }
  QPainter::setPen((QColor *)local_d0);
  QPainter::drawText((QRect *)local_d0,(int)&local_b8,(QString *)(ulong)flags,(QRect *)&local_80);
  pNVar4 = (this->d).d;
  if (pNVar4->direction == Left) {
    QPainter::rotate(180.0);
    local_98.d.d = (Data *)(double)(int)(local_a8 ^ 0xffffffffffffffff);
    local_98.d.ptr = (char16_t *)(double)(int)((local_a8 ^ 0xffffffffffffffff) >> 0x20);
    QPainter::translate((QPointF *)local_d0);
    pNVar4 = (this->d).d;
  }
  drawArrow((QPainter *)local_d0,&local_c8,&pNVar4->color);
  if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
    }
  }
  QStyleOption::~QStyleOption(local_58);
  QPainter::~QPainter((QPainter *)local_d0);
  return;
}

Assistant:

void
NavigationButton::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );

	const QRect r = rect();
	QRect arrowRect;
	QRect textRect;

	const int arrowWidth = qRound( (qreal) FingerGeometry::width() / 5.0 );
	const int arrowHeight = qRound( (qreal) FingerGeometry::height() / 3.0 );
	const int delta = ( r.height() - arrowHeight ) /2;

	int flags = Qt::TextSingleLine | Qt::TextShowMnemonic | Qt::AlignVCenter;

	switch( d->direction )
	{
		case Left :
		{
			arrowRect.setRect( r.width() - arrowWidth, r.y() + delta,
				arrowWidth, arrowHeight );

			textRect.setRect( r.x() + arrowWidth + c_offset, r.y(),
				r.width() - arrowWidth - c_offset, r.height() );

			flags |= Qt::AlignLeft;
		}
			break;

		case Right :
		{
			arrowRect.setRect( r.x() + r.width() - arrowWidth, r.y() + delta,
				arrowWidth, arrowHeight );

			textRect.setRect( r.x(), r.y(),
				r.width() - arrowWidth - c_offset, r.height() );

			flags |= Qt::AlignRight;
		}
			break;

		default :
			break;
	}

	QStyleOption opt;
	opt.initFrom( this );

	const QString t = d->makeString( text(), textRect, flags, opt );

	p.setPen( d->textColor );
	p.drawText( textRect, flags, t );

	if( d->direction == Left )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );
	}

	drawArrow( &p, arrowRect, d->color );
}